

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3AtoF(char *z,double *pResult,int length,u8 enc)

{
  ulong uVar1;
  char *pcVar2;
  byte bVar3;
  bool bVar4;
  float fVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  undefined7 in_register_00000009;
  uint uVar10;
  int iVar11;
  long lVar12;
  byte *pbVar13;
  long lVar14;
  byte *pbVar15;
  int iVar16;
  bool bVar17;
  double dVar18;
  int local_64;
  
  *pResult = 0.0;
  uVar9 = (uint)CONCAT71(in_register_00000009,enc);
  if (uVar9 == 1) {
    lVar14 = (long)length;
    uVar9 = 1;
    lVar12 = 1;
    pbVar13 = (byte *)z;
  }
  else {
    uVar10 = 3 - uVar9;
    uVar8 = (ulong)uVar10;
    bVar17 = length <= (int)uVar10;
    if (((int)uVar10 < length) &&
       (uVar8 = 3 - (CONCAT71(in_register_00000009,enc) & 0xffffffff), z[uVar8] == '\0')) {
      uVar8 = 5 - (ulong)enc;
      do {
        bVar17 = (long)length <= (long)uVar8;
        if ((long)length <= (long)uVar8) goto LAB_001636d9;
        uVar1 = uVar8 + 2;
        pcVar2 = z + uVar8;
        uVar8 = uVar1;
      } while (*pcVar2 == '\0');
      uVar8 = (ulong)((int)uVar1 - 2);
    }
LAB_001636d9:
    lVar14 = (ulong)enc + (long)(int)uVar8 + -3;
    pbVar13 = (byte *)(z + (uVar9 & 1));
    uVar9 = (uint)bVar17;
    lVar12 = 2;
  }
  pbVar15 = (byte *)(z + lVar14);
  bVar17 = pbVar13 < pbVar15;
  if (!bVar17) {
    return 0;
  }
  bVar3 = *pbVar13;
  while ((""[bVar3] & 1) != 0) {
    pbVar13 = pbVar13 + lVar12;
    bVar17 = pbVar13 < pbVar15;
    if (!bVar17) {
      return 0;
    }
    bVar3 = *pbVar13;
  }
  if (!bVar17) {
    return 0;
  }
  bVar3 = *pbVar13;
  iVar16 = 0;
  lVar14 = 0;
  if ((bVar3 - 0x2b & 0xfd) == 0) {
    lVar14 = lVar12;
  }
  pbVar13 = pbVar13 + lVar14;
  if (pbVar13 < pbVar15) {
    iVar16 = 0;
    do {
      if (*pbVar13 != 0x30) break;
      pbVar13 = pbVar13 + lVar12;
      iVar16 = iVar16 + 1;
    } while (pbVar13 < pbVar15);
  }
  iVar6 = 0;
  if (pbVar13 < pbVar15) {
    lVar14 = 0;
    do {
      if ((9 < (ulong)*pbVar13 - 0x30) || (0xcccccccccccccca < lVar14)) break;
      lVar14 = (long)(char)*pbVar13 + lVar14 * 10 + -0x30;
      pbVar13 = pbVar13 + lVar12;
      iVar16 = iVar16 + 1;
    } while (pbVar13 < pbVar15);
  }
  else {
    lVar14 = 0;
  }
  local_64 = 1;
  bVar17 = pbVar13 < pbVar15;
  if (bVar17) {
    if ((ulong)*pbVar13 - 0x3a < 0xfffffffffffffff6) {
      iVar6 = 0;
    }
    else {
      iVar7 = 0;
      do {
        pbVar13 = pbVar13 + lVar12;
        iVar6 = iVar7 + 1;
        bVar17 = pbVar13 < pbVar15;
        if (!bVar17) {
          iVar16 = iVar16 + iVar7 + 1;
          goto LAB_001638c0;
        }
        iVar7 = iVar6;
      } while (0xfffffffffffffff5 < (ulong)*pbVar13 - 0x3a);
      iVar16 = iVar16 + iVar6;
    }
    if (bVar17) {
      if (*pbVar13 == 0x2e) {
        for (; ((pbVar13 = pbVar13 + lVar12, pbVar13 < pbVar15 && ((ulong)*pbVar13 - 0x30 < 10)) &&
               (lVar14 < 0xccccccccccccccb)); lVar14 = lVar14 * 10 + -0x30 + (long)(char)*pbVar13) {
          iVar16 = iVar16 + 1;
          iVar6 = iVar6 + -1;
        }
        for (; (pbVar13 < pbVar15 && (0xfffffffffffffff5 < (ulong)*pbVar13 - 0x3a));
            pbVar13 = pbVar13 + lVar12) {
          iVar16 = iVar16 + 1;
        }
      }
      if (pbVar13 < pbVar15) {
        bVar4 = true;
        if ((*pbVar13 | 0x20) == 0x65) {
          pbVar13 = pbVar13 + lVar12;
          if (pbVar15 <= pbVar13) {
            iVar7 = 0;
            local_64 = 1;
            bVar17 = false;
            goto LAB_001638c5;
          }
          local_64 = 1;
          if (*pbVar13 == 0x2b) {
            pbVar13 = pbVar13 + lVar12;
          }
          else if (*pbVar13 == 0x2d) {
            pbVar13 = pbVar13 + lVar12;
            local_64 = -1;
          }
          if ((pbVar13 < pbVar15) && (uVar8 = (ulong)*pbVar13, 0xfffffffffffffff5 < uVar8 - 0x3a)) {
            iVar11 = 0;
            do {
              pbVar13 = pbVar13 + lVar12;
              iVar7 = (char)uVar8 + -0x30 + iVar11 * 10;
              if (9999 < iVar11) {
                iVar7 = 10000;
              }
              bVar17 = true;
            } while ((pbVar13 < pbVar15) &&
                    (uVar8 = (ulong)*pbVar13, iVar11 = iVar7, 0xfffffffffffffff5 < uVar8 - 0x3a));
            bVar4 = true;
          }
          else {
            iVar7 = 0;
            bVar4 = false;
            bVar17 = false;
          }
        }
        else {
          iVar7 = 0;
          local_64 = 1;
          bVar17 = true;
        }
        if (bVar4 && iVar16 != 0) {
          bVar17 = true;
          while ((pbVar13 < pbVar15 && ((""[*pbVar13] & 1) != 0))) {
            pbVar13 = pbVar13 + lVar12;
          }
        }
        goto LAB_001638c5;
      }
    }
  }
LAB_001638c0:
  iVar7 = 0;
  bVar17 = true;
LAB_001638c5:
  if (lVar14 == 0) {
    if (iVar16 == 0) {
      dVar18 = 0.0;
    }
    else {
      dVar18 = -0.0;
    }
    if (bVar3 != 0x2d) {
      dVar18 = 0.0;
    }
  }
  else {
    iVar6 = iVar7 * local_64 + iVar6;
    iVar7 = -iVar6;
    if (0 < iVar6) {
      iVar7 = iVar6;
    }
    if (iVar6 < 0) {
      uVar8 = lVar14 * -0x3333333333333333 + 0x1999999999999998;
      iVar11 = iVar7;
      if ((uVar8 >> 1 | (ulong)((uVar8 & 1) != 0) << 0x3f) < 0x1999999999999999) {
        do {
          iVar7 = iVar11 + -1;
          lVar14 = lVar14 / 10;
          uVar8 = lVar14 * -0x3333333333333333 + 0x1999999999999998;
          if (0x1999999999999998 < (uVar8 >> 1 | (ulong)((uVar8 & 1) != 0) << 0x3f)) break;
          bVar4 = 1 < iVar11;
          iVar11 = iVar7;
        } while (bVar4);
      }
    }
    else if ((lVar14 < 0xccccccccccccccc) && (lVar12 = lVar14, iVar11 = iVar7, iVar6 != 0)) {
      do {
        iVar7 = iVar11 + -1;
        lVar14 = lVar12 * 10;
        if (0x147ae147ae147ad < lVar12) break;
        bVar4 = 1 < iVar11;
        lVar12 = lVar14;
        iVar11 = iVar7;
      } while (bVar4);
    }
    lVar12 = -lVar14;
    if (bVar3 != 0x2d) {
      lVar12 = lVar14;
    }
    if (iVar7 == 0) {
      dVar18 = (double)lVar12;
    }
    else if (iVar7 - 0x134U < 0x22) {
      fVar5 = 1.0;
      if (0xd4c77b < ((uint)(iVar7 * 0x3f2b3885) >> 2 | iVar7 * 0x40000000)) {
        fVar5 = 1.0;
        do {
          iVar7 = iVar7 + -1;
          fVar5 = fVar5 * 10.0;
        } while (0xd4c77a < (iVar7 * 0x3f2b3885 + 0x1a98ef4U >> 2 | iVar7 * 0x40000000));
      }
      if (iVar6 < 0) {
        dVar18 = (double)((float)lVar12 / fVar5) / 1e+308;
      }
      else {
        dVar18 = (double)((float)lVar12 * fVar5) * 1e+308;
      }
    }
    else if (iVar7 < 0x156) {
      uVar10 = iVar7 * -0x45d1745d + 0xba2e8ba;
      fVar5 = 1.0;
      if (0xba2e8ba < (uVar10 >> 1 | (uint)((uVar10 & 1) != 0) << 0x1f)) {
        fVar5 = 1.0;
        do {
          fVar5 = fVar5 * 10.0;
          iVar11 = iVar7 * -0x45d1745d;
          iVar7 = iVar7 + -1;
          uVar10 = iVar11 + 0x51745d17;
        } while (0xba2e8ba < (uVar10 >> 1 | (uint)((uVar10 & 1) != 0) << 0x1f));
      }
      if (0 < iVar7) {
        iVar7 = iVar7 + 0x16;
        do {
          fVar5 = fVar5 * 1e+22;
          iVar7 = iVar7 + -0x16;
        } while (0x16 < iVar7);
      }
      if (iVar6 < 0) {
        dVar18 = (double)((float)lVar12 / fVar5);
      }
      else {
        dVar18 = (double)((float)lVar12 * fVar5);
      }
    }
    else if (iVar6 < 0) {
      dVar18 = (double)((ulong)(double)lVar12 & 0x8000000000000000);
    }
    else {
      dVar18 = (double)lVar12 * INFINITY;
    }
  }
  if (iVar16 < 1) {
    uVar9 = 0;
  }
  *pResult = dVar18;
  if (pbVar13 < pbVar15) {
    uVar9 = 0;
  }
  if (!bVar17) {
    uVar9 = 0;
  }
  return uVar9;
}

Assistant:

SQLITE_PRIVATE int sqlite3AtoF(const char *z, double *pResult, int length, u8 enc){
#ifndef SQLITE_OMIT_FLOATING_POINT
  int incr;
  const char *zEnd = z + length;
  /* sign * significand * (10 ^ (esign * exponent)) */
  int sign = 1;    /* sign of significand */
  i64 s = 0;       /* significand */
  int d = 0;       /* adjust exponent for shifting decimal point */
  int esign = 1;   /* sign of exponent */
  int e = 0;       /* exponent */
  int eValid = 1;  /* True exponent is either not used or is well-formed */
  double result;
  int nDigits = 0;
  int nonNum = 0;

  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  *pResult = 0.0;   /* Default return value, in case of an error */

  if( enc==SQLITE_UTF8 ){
    incr = 1;
  }else{
    int i;
    incr = 2;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    for(i=3-enc; i<length && z[i]==0; i+=2){}
    nonNum = i<length;
    zEnd = z+i+enc-3;
    z += (enc&1);
  }

  /* skip leading spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;
  if( z>=zEnd ) return 0;

  /* get sign of significand */
  if( *z=='-' ){
    sign = -1;
    z+=incr;
  }else if( *z=='+' ){
    z+=incr;
  }

  /* skip leading zeroes */
  while( z<zEnd && z[0]=='0' ) z+=incr, nDigits++;

  /* copy max significant digits to significand */
  while( z<zEnd && sqlite3Isdigit(*z) && s<((LARGEST_INT64-9)/10) ){
    s = s*10 + (*z - '0');
    z+=incr, nDigits++;
  }

  /* skip non-significant significand digits
  ** (increase exponent by d to shift decimal left) */
  while( z<zEnd && sqlite3Isdigit(*z) ) z+=incr, nDigits++, d++;
  if( z>=zEnd ) goto do_atof_calc;

  /* if decimal point is present */
  if( *z=='.' ){
    z+=incr;
    /* copy digits from after decimal to significand
    ** (decrease exponent by d to shift decimal right) */
    while( z<zEnd && sqlite3Isdigit(*z) && s<((LARGEST_INT64-9)/10) ){
      s = s*10 + (*z - '0');
      z+=incr, nDigits++, d--;
    }
    /* skip non-significant digits */
    while( z<zEnd && sqlite3Isdigit(*z) ) z+=incr, nDigits++;
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if exponent is present */
  if( *z=='e' || *z=='E' ){
    z+=incr;
    eValid = 0;
    if( z>=zEnd ) goto do_atof_calc;
    /* get sign of exponent */
    if( *z=='-' ){
      esign = -1;
      z+=incr;
    }else if( *z=='+' ){
      z+=incr;
    }
    /* copy digits to exponent */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      e = e<10000 ? (e*10 + (*z - '0')) : 10000;
      z+=incr;
      eValid = 1;
    }
  }

  /* skip trailing spaces */
  if( nDigits && eValid ){
    while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;
  }

do_atof_calc:
  /* adjust exponent by d, and update sign */
  e = (e*esign) + d;
  if( e<0 ) {
    esign = -1;
    e *= -1;
  } else {
    esign = 1;
  }

  /* if 0 significand */
  if( !s ) {
    /* In the IEEE 754 standard, zero is signed.
    ** Add the sign if we've seen at least one digit */
    result = (sign<0 && nDigits) ? -(double)0 : (double)0;
  } else {
    /* attempt to reduce exponent */
    if( esign>0 ){
      while( s<(LARGEST_INT64/10) && e>0 ) e--,s*=10;
    }else{
      while( !(s%10) && e>0 ) e--,s/=10;
    }

    /* adjust the sign of significand */
    s = sign<0 ? -s : s;

    /* if exponent, scale significand as appropriate
    ** and store in result. */
    if( e ){
      LONGDOUBLE_TYPE scale = 1.0;
      /* attempt to handle extremely small/large numbers better */
      if( e>307 && e<342 ){
        while( e%308 ) { scale *= 1.0e+1; e -= 1; }
        if( esign<0 ){
          result = s / scale;
          result /= 1.0e+308;
        }else{
          result = s * scale;
          result *= 1.0e+308;
        }
      }else if( e>=342 ){
        if( esign<0 ){
          result = 0.0*s;
        }else{
          result = 1e308*1e308*s;  /* Infinity */
        }
      }else{
        /* 1.0e+22 is the largest power of 10 than can be 
        ** represented exactly. */
        while( e%22 ) { scale *= 1.0e+1; e -= 1; }
        while( e>0 ) { scale *= 1.0e+22; e -= 22; }
        if( esign<0 ){
          result = s / scale;
        }else{
          result = s * scale;
        }
      }
    } else {
      result = (double)s;
    }
  }

  /* store the result */
  *pResult = result;

  /* return true if number and no extra non-whitespace chracters after */
  return z>=zEnd && nDigits>0 && eValid && nonNum==0;
#else
  return !sqlite3Atoi64(z, pResult, length, enc);
#endif /* SQLITE_OMIT_FLOATING_POINT */
}